

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O0

void __thiscall pbrt::MLTSampler::EnsureReady(MLTSampler *this,int index)

{
  ulong uVar1;
  size_t sVar2;
  reference this_00;
  int in_ESI;
  long in_RDI;
  float fVar3;
  Float FVar4;
  double dVar5;
  undefined1 auVar6 [16];
  Float delta;
  Float effSigma;
  int64_t nSmall;
  PrimarySample *X_i;
  Float in_stack_ffffffffffffffbc;
  Float in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  size_type in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar1 = (ulong)in_ESI;
  sVar2 = pstd::
          vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
          ::size((vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
                  *)(in_RDI + 0x28));
  if (sVar2 <= uVar1) {
    pstd::
    vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
    ::resize((vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
              *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
  }
  this_00 = pstd::
            vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
            ::operator[]((vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
                          *)(in_RDI + 0x28),(long)in_ESI);
  if (this_00->lastModificationIteration < *(long *)(in_RDI + 0x58)) {
    fVar3 = RNG::Uniform<float>((RNG *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                               );
    this_00->value = fVar3;
    this_00->lastModificationIteration = *(int64_t *)(in_RDI + 0x58);
  }
  PrimarySample::Backup(this_00);
  if ((*(byte *)(in_RDI + 0x50) & 1) == 0) {
    FVar4 = *(Float *)(in_RDI + 0x18);
    auVar6._0_4_ = (float)(*(long *)(in_RDI + 0x48) - this_00->lastModificationIteration);
    auVar6._4_12_ = SUB6012((undefined1  [60])0x0,0);
    std::sqrt(auVar6._0_8_);
    RNG::Uniform<float>((RNG *)CONCAT44(FVar4,in_stack_ffffffffffffffc0));
    FVar4 = SampleNormal(FVar4,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    this_00->value = FVar4 + this_00->value;
    dVar5 = pstd::floor((double)(ulong)(uint)this_00->value);
    this_00->value = this_00->value - SUB84(dVar5,0);
  }
  else {
    fVar3 = RNG::Uniform<float>((RNG *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                               );
    this_00->value = fVar3;
  }
  this_00->lastModificationIteration = *(int64_t *)(in_RDI + 0x48);
  return;
}

Assistant:

PBRT_CPU_GPU void MLTSampler::EnsureReady(int index) {
#ifdef PBRT_IS_GPU_CODE
    LOG_FATAL("MLTSampler not supported on GPU--needs vector resize...");
    return;
#else
    // Enlarge _MLTSampler::X_ if necessary and get current $\VEC{X}_i$
    if (index >= X.size())
        X.resize(index + 1);
    PrimarySample &X_i = X[index];

    // Reset $\VEC{X}_i$ if a large step took place in the meantime
    if (X_i.lastModificationIteration < lastLargeStepIteration) {
        X_i.value = rng.Uniform<Float>();
        X_i.lastModificationIteration = lastLargeStepIteration;
    }

    // Apply remaining sequence of mutations to _sample_
    X_i.Backup();
    if (largeStep)
        X_i.value = rng.Uniform<Float>();
    else {
        int64_t nSmall = currentIteration - X_i.lastModificationIteration;
        // Apply _nSmall_ small step mutations to $\VEC{X}_i$
        Float effSigma = sigma * std::sqrt((Float)nSmall);
        Float delta = SampleNormal(rng.Uniform<Float>(), 0, effSigma);
        X_i.value += delta;
        X_i.value -= pstd::floor(X_i.value);
    }
    X_i.lastModificationIteration = currentIteration;

#endif
}